

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

string * __thiscall pbrt::SpectrumHandle::ParameterString_abi_cxx11_(SpectrumHandle *this)

{
  undefined8 in_RSI;
  string *in_RDI;
  anon_class_1_0_00000001 ps;
  
  TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBSpectrum,pbrt::RGBReflectanceSpectrum,pbrt::BlackbodySpectrum>
  ::DispatchCPU<pbrt::SpectrumHandle::ParameterString[abi:cxx11]()const::__0>
            ((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string SpectrumHandle::ParameterString() const {
    auto ps = [&](auto ptr) { return ptr->ParameterString(); };
    return DispatchCPU(ps);
}